

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

int * Abc_FrameReadMiniAigEquivClasses(Abc_Frame_t *pAbc)

{
  int *piVar1;
  Vec_Int_t *__ptr;
  
  if (pAbc->pGiaMiniAig == (Gia_Man_t *)0x0) {
    puts("GIA derived from MiniAig is not available.");
  }
  if (pAbc->vCopyMiniAig == (Vec_Int_t *)0x0) {
    puts("Mapping of MiniAig nodes is not available.");
  }
  if (pAbc->pGia2 == (Gia_Man_t *)0x0) {
    puts("Internal GIA with equivalence classes is not available.");
  }
  if (pAbc->pGia2->pReprs == (Gia_Rpr_t *)0x0) {
    puts("Equivalence classes of internal GIA are not available.");
  }
  if (pAbc->pGia2->nObjs != pAbc->pGiaMiniAig->nObjs) {
    puts("Internal GIA with equivalence classes is not directly derived from MiniAig.");
  }
  __ptr = Gia_ManMapEquivAfterScorr(pAbc->pGia2,pAbc->vCopyMiniAig);
  piVar1 = __ptr->pArray;
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  __ptr->pArray = (int *)0x0;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return piVar1;
}

Assistant:

int * Abc_FrameReadMiniAigEquivClasses( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vRes;
    int * pRes;
    if ( pAbc->pGiaMiniAig == NULL )
        printf( "GIA derived from MiniAig is not available.\n" );
    if ( pAbc->vCopyMiniAig == NULL )
        printf( "Mapping of MiniAig nodes is not available.\n" );
    if ( pAbc->pGia2 == NULL )
        printf( "Internal GIA with equivalence classes is not available.\n" );
    if ( pAbc->pGia2->pReprs == NULL )
        printf( "Equivalence classes of internal GIA are not available.\n" );
    if ( Gia_ManObjNum(pAbc->pGia2) != Gia_ManObjNum(pAbc->pGiaMiniAig) )
        printf( "Internal GIA with equivalence classes is not directly derived from MiniAig.\n" );
    // derive the set of equivalent node pairs
    vRes = Gia_ManMapEquivAfterScorr( pAbc->pGia2, pAbc->vCopyMiniAig );
    pRes = Vec_IntReleaseArray( vRes );
    Vec_IntFree( vRes );
    return pRes;
}